

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdNameMap.h
# Opt level: O2

void __thiscall
Rml::IdNameMap<Rml::PropertyId>::IdNameMap
          (IdNameMap<Rml::PropertyId> *this,size_t num_ids_to_reserve)

{
  size_t *psVar1;
  allocator<char> local_39;
  String local_38;
  
  (this->name_map).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->name_map).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name_map).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = &(this->reverse_map).mMask;
  (this->reverse_map).mKeyVals = (Node *)psVar1;
  (this->reverse_map).mInfo = (uint8_t *)psVar1;
  (this->reverse_map).mNumElements = 0;
  (this->reverse_map).mMask = 0;
  (this->reverse_map).mMaxNumElementsAllowed = 0;
  (this->reverse_map).mInfoInc = 0x20;
  (this->reverse_map).mInfoHashShift = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this,num_ids_to_reserve);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->reverse_map,num_ids_to_reserve);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"invalid",&local_39);
  AddPair(this,Invalid,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

IdNameMap(size_t num_ids_to_reserve)
	{
		static_assert((int)ID::Invalid == 0, "Invalid id must be zero");
		name_map.reserve(num_ids_to_reserve);
		reverse_map.reserve(num_ids_to_reserve);
		AddPair(ID::Invalid, "invalid");
	}